

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O3

int SharpYuvConvert(void *r_ptr,void *g_ptr,void *b_ptr,int rgb_step,int rgb_stride,
                   int rgb_bit_depth,void *y_ptr,int y_stride,void *u_ptr,int u_stride,void *v_ptr,
                   int v_stride,int yuv_bit_depth,int width,int height,
                   SharpYuvConversionMatrix *yuv_matrix)

{
  int iVar1;
  SharpYuvOptions options;
  
  options.yuv_matrix = yuv_matrix;
  options.transfer_type = kSharpYuvTransferFunctionSrgb;
  iVar1 = SharpYuvConvertWithOptions
                    (r_ptr,g_ptr,b_ptr,rgb_step,rgb_stride,rgb_bit_depth,y_ptr,y_stride,u_ptr,
                     u_stride,v_ptr,v_stride,yuv_bit_depth,width,height,&options);
  return iVar1;
}

Assistant:

int SharpYuvConvert(const void* r_ptr, const void* g_ptr, const void* b_ptr,
                    int rgb_step, int rgb_stride, int rgb_bit_depth,
                    void* y_ptr, int y_stride, void* u_ptr, int u_stride,
                    void* v_ptr, int v_stride, int yuv_bit_depth, int width,
                    int height, const SharpYuvConversionMatrix* yuv_matrix) {
  SharpYuvOptions options;
  options.yuv_matrix = yuv_matrix;
  options.transfer_type = kSharpYuvTransferFunctionSrgb;
  return SharpYuvConvertWithOptions(
      r_ptr, g_ptr, b_ptr, rgb_step, rgb_stride, rgb_bit_depth, y_ptr, y_stride,
      u_ptr, u_stride, v_ptr, v_stride, yuv_bit_depth, width, height, &options);
}